

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_api_v2.c
# Opt level: O1

MPP_RET h264e_proc_h264_cfg(MppEncH264Cfg *dst,MppEncH264Cfg *src)

{
  byte *pbVar1;
  bool bVar2;
  MPP_RET extraout_EAX;
  MPP_RET MVar3;
  ulong uVar4;
  undefined7 uVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  
  MVar3 = src->change;
  uVar4 = (ulong)(uint)MVar3;
  if (MVar3 != MPP_OK) {
    if ((MVar3 & ~MPP_ERR_UNKNOW) != MPP_OK) {
      dst->stream_type = src->stream_type;
    }
    if (((MVar3 & ~MPP_ERR_NULL_PTR) != MPP_OK) &&
       ((dst->profile != src->profile || (dst->level != src->level)))) {
      dst->profile = src->profile;
      dst->level = src->level;
      *(byte *)&dst->change = (byte)dst->change | 2;
    }
    if ((((uint)MVar3 >> 10 & 1) != 0) && (dst->poc_type != src->poc_type)) {
      dst->poc_type = src->poc_type;
      pbVar1 = (byte *)((long)&dst->change + 1);
      *pbVar1 = *pbVar1 | 4;
    }
    if ((((uint)MVar3 >> 0xb & 1) != 0) && (dst->log2_max_poc_lsb != src->log2_max_poc_lsb)) {
      dst->log2_max_poc_lsb = src->log2_max_poc_lsb;
      pbVar1 = (byte *)((long)&dst->change + 1);
      *pbVar1 = *pbVar1 | 8;
    }
    if ((((uint)MVar3 >> 0xc & 1) != 0) && (dst->log2_max_frame_num != src->log2_max_frame_num)) {
      dst->log2_max_frame_num = src->log2_max_frame_num;
      pbVar1 = (byte *)((long)&dst->change + 1);
      *pbVar1 = *pbVar1 | 0x10;
    }
    if ((((uint)MVar3 >> 0xd & 1) != 0) && (dst->gaps_not_allowed != src->gaps_not_allowed)) {
      dst->gaps_not_allowed = src->gaps_not_allowed;
      pbVar1 = (byte *)((long)&dst->change + 1);
      *pbVar1 = *pbVar1 | 0x20;
    }
    if (((MVar3 & ~MPP_ERR_OPEN_FILE) != MPP_OK) &&
       ((dst->entropy_coding_mode_ex != src->entropy_coding_mode_ex ||
        (dst->cabac_init_idc_ex != src->cabac_init_idc_ex)))) {
      dst->entropy_coding_mode_ex = src->entropy_coding_mode_ex;
      dst->cabac_init_idc_ex = src->cabac_init_idc_ex;
      *(byte *)&dst->change = (byte)dst->change | 4;
    }
    if (((MVar3 & 0x10) != MPP_OK) && (dst->transform8x8_mode_ex != src->transform8x8_mode_ex)) {
      dst->transform8x8_mode_ex = src->transform8x8_mode_ex;
      *(byte *)&dst->change = (byte)dst->change | 0x10;
    }
    if (((MVar3 & 0x20) != MPP_OK) &&
       (dst->constrained_intra_pred_mode != src->constrained_intra_pred_mode)) {
      dst->constrained_intra_pred_mode = src->constrained_intra_pred_mode;
      *(byte *)&dst->change = (byte)dst->change | 0x20;
    }
    if (((MVar3 & 0x40) != MPP_OK) &&
       ((dst->chroma_cb_qp_offset != src->chroma_cb_qp_offset ||
        (dst->chroma_cr_qp_offset != src->chroma_cr_qp_offset)))) {
      dst->chroma_cb_qp_offset = src->chroma_cb_qp_offset;
      dst->chroma_cr_qp_offset = src->chroma_cr_qp_offset;
      *(byte *)&dst->change = (byte)dst->change | 0x40;
    }
    if (((char)MVar3 < '\0') &&
       (((dst->deblock_disable != src->deblock_disable ||
         (dst->deblock_offset_alpha != src->deblock_offset_alpha)) ||
        (dst->deblock_offset_beta != src->deblock_offset_beta)))) {
      dst->deblock_disable = src->deblock_disable;
      dst->deblock_offset_alpha = src->deblock_offset_alpha;
      dst->deblock_offset_beta = src->deblock_offset_beta;
      *(byte *)&dst->change = (byte)dst->change | 0x80;
    }
    if (((uint)MVar3 >> 8 & 1) != 0) {
      dst->use_longterm = src->use_longterm;
    }
    if ((((uint)MVar3 >> 9 & 1) != 0) && (dst->scaling_list_mode != src->scaling_list_mode)) {
      dst->scaling_list_mode = src->scaling_list_mode;
      pbVar1 = (byte *)((long)&dst->change + 1);
      *pbVar1 = *pbVar1 | 2;
    }
    if ((((uint)MVar3 >> 0x14 & 1) != 0) &&
       ((dst->intra_refresh_mode != src->intra_refresh_mode ||
        (dst->intra_refresh_arg != src->intra_refresh_arg)))) {
      dst->intra_refresh_mode = src->intra_refresh_mode;
      dst->intra_refresh_arg = src->intra_refresh_arg;
      pbVar1 = (byte *)((long)&dst->change + 2);
      *pbVar1 = *pbVar1 | 0x10;
    }
    if ((((uint)MVar3 >> 0x15 & 1) != 0) && (dst->max_ltr_frames != src->max_ltr_frames)) {
      dst->max_ltr_frames = src->max_ltr_frames;
      pbVar1 = (byte *)((long)&dst->change + 2);
      *pbVar1 = *pbVar1 | 0x20;
    }
    if ((((uint)MVar3 >> 0x16 & 1) != 0) && (dst->max_tid != src->max_tid)) {
      dst->max_tid = src->max_tid;
      pbVar1 = (byte *)((long)&dst->change + 2);
      *pbVar1 = *pbVar1 | 0x40;
    }
    if ((((uint)MVar3 >> 0x17 & 1) != 0) && (dst->prefix_mode != src->prefix_mode)) {
      dst->prefix_mode = src->prefix_mode;
      pbVar1 = (byte *)((long)&dst->change + 2);
      *pbVar1 = *pbVar1 | 0x80;
    }
    if ((((uint)MVar3 >> 0x18 & 1) != 0) && (dst->base_layer_pid != src->base_layer_pid)) {
      dst->base_layer_pid = src->base_layer_pid;
      pbVar1 = (byte *)((long)&dst->change + 3);
      *pbVar1 = *pbVar1 | 1;
    }
    if (((uint)MVar3 >> 0x1d & 1) != 0) {
      uVar7 = src->constraint_set;
      uVar4 = (ulong)uVar7;
      if (dst->constraint_set != uVar7) {
        dst->constraint_set = uVar7;
        pbVar1 = (byte *)((long)&dst->change + 3);
        *pbVar1 = *pbVar1 | 0x20;
      }
    }
    uVar7 = dst->entropy_coding_mode_ex;
    uVar10 = dst->cabac_init_idc_ex;
    uVar8 = dst->transform8x8_mode_ex;
    uVar6 = dst->profile - 0x2c;
    uVar5 = (undefined7)(uVar4 >> 8);
    bVar9 = (byte)(0x100000400001 >> ((byte)uVar6 & 0x3f)) & uVar6 < 0x2d;
    if ((uVar7 != 0 & bVar9) == 1) {
      _mpp_log_l(2,"h264e_api_v2","Warning: invalid cabac_en %d for profile %d, set to 0.\n",
                 (char *)0x0,(ulong)uVar7);
      uVar7 = 0;
      uVar5 = extraout_var;
    }
    if ((bVar9 & -1 < (int)uVar10) == 1) {
      _mpp_log_l(2,"h264e_api_v2","Warning: invalid cabac_init_idc %d for profile %d, set to -1.\n",
                 (char *)0x0,(ulong)uVar10,(ulong)(uint)dst->profile);
      uVar10 = 0xffffffff;
      uVar5 = extraout_var_00;
    }
    bVar2 = dst->profile < 100;
    MVar3 = (MPP_RET)CONCAT71(uVar5,bVar2);
    if (uVar8 != 0 && bVar2) {
      _mpp_log_l(2,"h264e_api_v2",
                 "Warning: invalid transform8x8_mode %d for profile %d, set to 0.\n",(char *)0x0,
                 (ulong)uVar8);
      uVar8 = 0;
      MVar3 = extraout_EAX;
    }
    dst->entropy_coding_mode = uVar7;
    dst->cabac_init_idc = uVar10;
    dst->transform8x8_mode = uVar8;
  }
  src->change = 0;
  return MVar3;
}

Assistant:

static MPP_RET h264e_proc_h264_cfg(MppEncH264Cfg *dst, MppEncH264Cfg *src)
{
    MPP_RET ret = MPP_OK;
    RK_U32 change = src->change;

    // TODO: do codec check first
    if (change) {
        RK_S32 entropy_coding_mode;
        RK_S32 cabac_init_idc;
        RK_S32 transform8x8_mode;
        RK_U32 disable_cabac;

        if (change & MPP_ENC_H264_CFG_STREAM_TYPE)
            dst->stream_type = src->stream_type;

        if ((change & MPP_ENC_H264_CFG_CHANGE_PROFILE) &&
            ((dst->profile != src->profile) || (dst->level != src->level))) {
            dst->profile = src->profile;
            dst->level = src->level;
            dst->change |= MPP_ENC_H264_CFG_CHANGE_PROFILE;
        }

        if ((change & MPP_ENC_H264_CFG_CHANGE_POC_TYPE) &&
            (dst->poc_type != src->poc_type)) {
            dst->poc_type = src->poc_type;
            dst->change |= MPP_ENC_H264_CFG_CHANGE_POC_TYPE;
        }

        if ((change & MPP_ENC_H264_CFG_CHANGE_MAX_POC_LSB) &&
            (dst->log2_max_poc_lsb != src->log2_max_poc_lsb)) {
            dst->log2_max_poc_lsb = src->log2_max_poc_lsb;
            dst->change |= MPP_ENC_H264_CFG_CHANGE_MAX_POC_LSB;
        }

        if ((change & MPP_ENC_H264_CFG_CHANGE_MAX_FRM_NUM) &&
            (dst->log2_max_frame_num != src->log2_max_frame_num)) {
            dst->log2_max_frame_num = src->log2_max_frame_num;
            dst->change |= MPP_ENC_H264_CFG_CHANGE_MAX_FRM_NUM;
        }

        if ((change & MPP_ENC_H264_CFG_CHANGE_GAPS_IN_FRM_NUM) &&
            (dst->gaps_not_allowed != src->gaps_not_allowed)) {
            dst->gaps_not_allowed = src->gaps_not_allowed;
            dst->change |= MPP_ENC_H264_CFG_CHANGE_GAPS_IN_FRM_NUM;
        }

        if ((change & MPP_ENC_H264_CFG_CHANGE_ENTROPY) &&
            ((dst->entropy_coding_mode_ex != src->entropy_coding_mode_ex) ||
             (dst->cabac_init_idc_ex != src->cabac_init_idc_ex))) {
            dst->entropy_coding_mode_ex = src->entropy_coding_mode_ex;
            dst->cabac_init_idc_ex = src->cabac_init_idc_ex;
            dst->change |= MPP_ENC_H264_CFG_CHANGE_ENTROPY;
        }

        if ((change & MPP_ENC_H264_CFG_CHANGE_TRANS_8x8) &&
            (dst->transform8x8_mode_ex != src->transform8x8_mode_ex)) {
            dst->transform8x8_mode_ex = src->transform8x8_mode_ex;
            dst->change |= MPP_ENC_H264_CFG_CHANGE_TRANS_8x8;
        }

        if ((change & MPP_ENC_H264_CFG_CHANGE_CONST_INTRA) &&
            (dst->constrained_intra_pred_mode != src->constrained_intra_pred_mode)) {
            dst->constrained_intra_pred_mode = src->constrained_intra_pred_mode;
            dst->change |= MPP_ENC_H264_CFG_CHANGE_CONST_INTRA;
        }

        if ((change & MPP_ENC_H264_CFG_CHANGE_CHROMA_QP) &&
            (dst->chroma_cb_qp_offset != src->chroma_cb_qp_offset ||
             dst->chroma_cr_qp_offset != src->chroma_cr_qp_offset)) {
            dst->chroma_cb_qp_offset = src->chroma_cb_qp_offset;
            dst->chroma_cr_qp_offset = src->chroma_cr_qp_offset;
            dst->change |= MPP_ENC_H264_CFG_CHANGE_CHROMA_QP;
        }

        if ((change & MPP_ENC_H264_CFG_CHANGE_DEBLOCKING) &&
            ((dst->deblock_disable != src->deblock_disable) ||
             (dst->deblock_offset_alpha != src->deblock_offset_alpha) ||
             (dst->deblock_offset_beta != src->deblock_offset_beta))) {
            dst->deblock_disable = src->deblock_disable;
            dst->deblock_offset_alpha = src->deblock_offset_alpha;
            dst->deblock_offset_beta = src->deblock_offset_beta;
            dst->change |= MPP_ENC_H264_CFG_CHANGE_DEBLOCKING;
        }

        if (change & MPP_ENC_H264_CFG_CHANGE_LONG_TERM)
            dst->use_longterm = src->use_longterm;

        if ((change & MPP_ENC_H264_CFG_CHANGE_SCALING_LIST) &&
            (dst->scaling_list_mode != src->scaling_list_mode)) {
            dst->scaling_list_mode = src->scaling_list_mode;
            dst->change |= MPP_ENC_H264_CFG_CHANGE_SCALING_LIST;
        }

        if ((change & MPP_ENC_H264_CFG_CHANGE_INTRA_REFRESH) &&
            ((dst->intra_refresh_mode != src->intra_refresh_mode) ||
             (dst->intra_refresh_arg != src->intra_refresh_arg))) {
            dst->intra_refresh_mode = src->intra_refresh_mode;
            dst->intra_refresh_arg = src->intra_refresh_arg;
            dst->change |= MPP_ENC_H264_CFG_CHANGE_INTRA_REFRESH;
        }

        if ((change & MPP_ENC_H264_CFG_CHANGE_MAX_LTR) &&
            (dst->max_ltr_frames != src->max_ltr_frames)) {
            dst->max_ltr_frames = src->max_ltr_frames;
            dst->change |= MPP_ENC_H264_CFG_CHANGE_MAX_LTR;
        }

        if ((change & MPP_ENC_H264_CFG_CHANGE_MAX_TID) &&
            (dst->max_tid != src->max_tid)) {
            dst->max_tid = src->max_tid;
            dst->change |= MPP_ENC_H264_CFG_CHANGE_MAX_TID;
        }

        if ((change & MPP_ENC_H264_CFG_CHANGE_ADD_PREFIX) &&
            (dst->prefix_mode != src->prefix_mode)) {
            dst->prefix_mode = src->prefix_mode;
            dst->change |= MPP_ENC_H264_CFG_CHANGE_ADD_PREFIX;
        }

        if ((change & MPP_ENC_H264_CFG_CHANGE_BASE_LAYER_PID) &&
            (dst->base_layer_pid != src->base_layer_pid)) {
            dst->base_layer_pid = src->base_layer_pid;
            dst->change |= MPP_ENC_H264_CFG_CHANGE_BASE_LAYER_PID;
        }

        if ((change & MPP_ENC_H264_CFG_CHANGE_CONSTRAINT_SET) &&
            (dst->constraint_set != src->constraint_set)) {
            dst->constraint_set = src->constraint_set;
            dst->change |= MPP_ENC_H264_CFG_CHANGE_CONSTRAINT_SET;
        }

        // check user h.264 config. If valid, set to HAL.
        entropy_coding_mode = dst->entropy_coding_mode_ex;
        cabac_init_idc = dst->cabac_init_idc_ex;
        transform8x8_mode = dst->transform8x8_mode_ex;

        disable_cabac = (H264_PROFILE_FREXT_CAVLC444 == dst->profile ||
                         H264_PROFILE_BASELINE == dst->profile ||
                         H264_PROFILE_EXTENDED == dst->profile);

        if (disable_cabac && entropy_coding_mode) {
            mpp_err("Warning: invalid cabac_en %d for profile %d, set to 0.\n",
                    entropy_coding_mode, dst->profile);

            entropy_coding_mode = 0;
        }

        if (disable_cabac && cabac_init_idc >= 0) {
            mpp_err("Warning: invalid cabac_init_idc %d for profile %d, set to -1.\n",
                    cabac_init_idc, dst->profile);

            cabac_init_idc = -1;
        }

        if (dst->profile < H264_PROFILE_HIGH && transform8x8_mode) {
            mpp_err("Warning: invalid transform8x8_mode %d for profile %d, set to 0.\n",
                    transform8x8_mode, dst->profile);

            transform8x8_mode = 0;
        }

        dst->entropy_coding_mode = entropy_coding_mode;
        dst->cabac_init_idc = cabac_init_idc;
        dst->transform8x8_mode = transform8x8_mode;
    }

    src->change = 0;
    return ret;
}